

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_debug.c
# Opt level: O0

void lj_debug_addloc(lua_State *L,char *msg,cTValue *frame,cTValue *nextframe)

{
  uint uVar1;
  uint *in_RDX;
  undefined8 in_RSI;
  lua_State *in_RDI;
  char buf [60];
  BCLine line;
  GCfunc *fn;
  undefined1 auStack_68 [16];
  cTValue *in_stack_ffffffffffffffa8;
  GCfunc *in_stack_ffffffffffffffb0;
  lua_State *in_stack_ffffffffffffffb8;
  
  if (((in_RDX == (uint *)0x0) || (*(char *)((ulong)*in_RDX + 6) != '\0')) ||
     (uVar1 = debug_frameline(in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0,
                              in_stack_ffffffffffffffa8), (int)uVar1 < 0)) {
    lj_str_pushf(in_RDI,"%s",in_RSI);
  }
  else {
    lj_debug_shortname((char *)in_stack_ffffffffffffffb0,
                       (GCstr *)&in_stack_ffffffffffffffa8->field_2);
    lj_str_pushf(in_RDI,"%s:%d: %s",auStack_68,(ulong)uVar1,in_RSI);
  }
  return;
}

Assistant:

void lj_debug_addloc(lua_State *L, const char *msg,
		     cTValue *frame, cTValue *nextframe)
{
  if (frame) {
    GCfunc *fn = frame_func(frame);
    if (isluafunc(fn)) {
      BCLine line = debug_frameline(L, fn, nextframe);
      if (line >= 0) {
	char buf[LUA_IDSIZE];
	lj_debug_shortname(buf, proto_chunkname(funcproto(fn)));
	lj_str_pushf(L, "%s:%d: %s", buf, line, msg);
	return;
      }
    }
  }
  lj_str_pushf(L, "%s", msg);
}